

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::rp_hsol_pv_c(HDual *this,HVector *column)

{
  reference pvVar1;
  long in_RSI;
  long in_RDI;
  char *pcVar2;
  double extraout_XMM0_Qa;
  int i;
  double *columnArray;
  uint local_1c;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),0);
  if (*(int *)(in_RDI + 0x78) < 0x15) {
    pcVar2 = "\nPvC: %2d  \n";
    printf("\nPvC: %2d  \n",(ulong)*(uint *)(in_RDI + 0x6cc));
    for (local_1c = 0; (int)local_1c < *(int *)(in_RDI + 0x7c); local_1c = local_1c + 1) {
      std::abs((int)pcVar2);
      if (0.001 < extraout_XMM0_Qa) {
        pcVar2 = " %2d: %4.1g\n";
        printf(" %2d: %4.1g\n",pvVar1[(int)local_1c],(ulong)local_1c);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void HDual::rp_hsol_pv_c(HVector *column) const {
  const double *columnArray = &column->array[0];
  // Alias
  //Set limits on problem size for reporting
  //	const int mx_rp_numTot = 20;
  if (numCol > mx_rp_numTot)
    return;
  printf("\nPvC: %2d  \n", columnIn);
  for (int i = 0; i < numRow; i++) {
    if (abs(columnArray[i]) > 1e-3)
      printf(" %2d: %4.1g\n", i, columnArray[i]);
  }
  printf("\n");
}